

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O2

void __thiscall
btBox2dShape::getPreferredPenetrationDirection
          (btBox2dShape *this,int index,btVector3 *penetrationVector)

{
  btScalar bVar1;
  btScalar bVar2;
  ulong uVar3;
  
  if ((uint)index < 6) {
    uVar3 = (ulong)(uint)index;
    bVar1 = *(btScalar *)(&DAT_001b101c + uVar3 * 4);
    bVar2 = *(btScalar *)(&DAT_001b1034 + uVar3 * 4);
    penetrationVector->m_floats[0] = *(btScalar *)(&DAT_001b1004 + uVar3 * 4);
    penetrationVector->m_floats[1] = bVar1;
    penetrationVector->m_floats[2] = bVar2;
    penetrationVector->m_floats[3] = 0.0;
  }
  return;
}

Assistant:

virtual void	getPreferredPenetrationDirection(int index, btVector3& penetrationVector) const
	{
		switch (index)
		{
		case 0:
			penetrationVector.setValue(btScalar(1.),btScalar(0.),btScalar(0.));
			break;
		case 1:
			penetrationVector.setValue(btScalar(-1.),btScalar(0.),btScalar(0.));
			break;
		case 2:
			penetrationVector.setValue(btScalar(0.),btScalar(1.),btScalar(0.));
			break;
		case 3:
			penetrationVector.setValue(btScalar(0.),btScalar(-1.),btScalar(0.));
			break;
		case 4:
			penetrationVector.setValue(btScalar(0.),btScalar(0.),btScalar(1.));
			break;
		case 5:
			penetrationVector.setValue(btScalar(0.),btScalar(0.),btScalar(-1.));
			break;
		default:
			btAssert(0);
		}
	}